

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
               (string *s,char *fmt,int *v,int *args,int *args_1,int *args_2,int *args_3,int *args_4
               ,MajorantGrid **args_5)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  MajorantGrid **unaff_RBX;
  string *in_RDI;
  int *in_R8;
  int *in_R9;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd70;
  string *psVar3;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_260 [8];
  int *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffdf0;
  MajorantGrid **in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  LogLevel in_stack_fffffffffffffe14;
  string local_90 [32];
  undefined4 local_70;
  undefined1 local_5b;
  byte local_5a;
  byte local_59;
  string local_58 [16];
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar1 = std::__cxx11::string::find((char)local_58,0x2a);
  local_59 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,0x73);
  local_5a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,100);
  local_5b = lVar1 != -1;
  if ((local_59 & 1) == 0) {
    if ((bool)local_5b) {
      psVar3 = local_58;
      uVar2 = std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_90);
      std::__cxx11::string::~string(local_90);
    }
    else if ((local_5a & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                 (char *)in_stack_fffffffffffffdf8);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
      std::ostream::operator<<(&stack0xfffffffffffffdf8,*(int *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffdc8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
    }
    stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (int *)in_RDI,unaff_RBX);
    local_70 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdf8);
    local_70 = 1;
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}